

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void benchmark::internal::BenchmarkImp::AddRange
               (vector<int,_std::allocator<int>_> *dst,int lo,int hi,int mult)

{
  int iVar1;
  char *check;
  int lo_local;
  CheckHandler local_38;
  int hi_local;
  
  lo_local = lo;
  hi_local = hi;
  if (lo < 0) {
    check = "(lo) >= (0)";
    iVar1 = 0x27d;
  }
  else {
    GetNullLogInstance();
    if (hi < lo) {
      check = "(hi) >= (lo)";
      iVar1 = 0x27e;
    }
    else {
      GetNullLogInstance();
      if (1 < mult) {
        GetNullLogInstance();
        std::vector<int,_std::allocator<int>_>::push_back(dst,&lo_local);
        iVar1 = (int)(0x7fffffff / (ulong)(uint)mult);
        if (hi <= iVar1) {
          iVar1 = hi;
        }
        local_38.log_._0_4_ = 1;
        while( true ) {
          if (iVar1 <= (int)local_38.log_) break;
          if (lo_local < (int)local_38.log_) {
            std::vector<int,_std::allocator<int>_>::push_back(dst,(value_type_conflict *)&local_38);
          }
          local_38.log_._0_4_ = (int)local_38.log_ * mult;
        }
        if (lo_local != hi) {
          std::vector<int,_std::allocator<int>_>::push_back(dst,&hi_local);
        }
        return;
      }
      check = "(mult) >= (2)";
      iVar1 = 0x27f;
    }
  }
  CheckHandler::CheckHandler
            (&local_38,check,
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"AddRange",iVar1);
  CheckHandler::~CheckHandler(&local_38);
}

Assistant:

void BenchmarkImp::AddRange(std::vector<int>* dst, int lo, int hi, int mult) {
  CHECK_GE(lo, 0);
  CHECK_GE(hi, lo);
  CHECK_GE(mult, 2);

  // Add "lo"
  dst->push_back(lo);

  static const int kint32max = std::numeric_limits<int32_t>::max();

  // Now space out the benchmarks in multiples of "mult"
  for (int32_t i = 1; i < kint32max/mult; i *= mult) {
    if (i >= hi) break;
    if (i > lo) {
      dst->push_back(i);
    }
  }
  // Add "hi" (if different from "lo")
  if (hi != lo) {
    dst->push_back(hi);
  }
}